

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

SUNErrCode SUNMatHermitianTransposeVec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = N_VGetArrayPointer(x);
  lVar4 = N_VGetArrayPointer();
  plVar1 = (long *)A->content;
  lVar6 = 0;
  lVar5 = plVar1[1];
  if (plVar1[1] < 1) {
    lVar5 = lVar6;
  }
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *(undefined8 *)(lVar4 + lVar6 * 8) = 0;
  }
  for (lVar6 = 0; lVar6 != lVar5; lVar6 = lVar6 + 1) {
    lVar2 = *(long *)(plVar1[4] + lVar6 * 8);
    lVar7 = *plVar1;
    if (*plVar1 < 1) {
      lVar7 = 0;
    }
    for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
      *(double *)(lVar4 + lVar6 * 8) =
           *(double *)(lVar2 + lVar8 * 8) * *(double *)(lVar3 + lVar8 * 8) +
           *(double *)(lVar4 + lVar6 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatHermitianTransposeVec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, y, x), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if NULL data pointers) */
  sunrealtype *xd, *yd;
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);
  SUNAssert(xd != yd, SUN_ERR_MEM_FAIL);

  /* Perform operation y = A^T x */
  for (sunindextype i = 0; i < SM_COLUMNS_D(A); i++) { yd[i] = ZERO; }
  for (sunindextype i = 0; i < SM_COLUMNS_D(A); i++)
  {
    sunrealtype* row_i = SM_COLUMN_D(A, i);
    for (sunindextype j = 0; j < SM_ROWS_D(A); j++)
    {
      yd[i] += row_i[j] * xd[j];
    }
  }
  return SUN_SUCCESS;
}